

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O3

Unique<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,std::__cxx11::string&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *args_1,shared_ptr<anurbs::Attributes> *args_2
          )

{
  Entry<anurbs::NurbsCurveGeometry<3L>_> *this_00;
  shared_ptr<anurbs::Attributes> local_48;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> local_38;
  
  this_00 = (Entry<anurbs::NurbsCurveGeometry<3L>_> *)operator_new(0x48);
  local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args_1->super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args_1->super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args_2->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args_2->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Entry<anurbs::NurbsCurveGeometry<3L>_>::Entry(this_00,args,&local_38,&local_48);
  *(Entry<anurbs::NurbsCurveGeometry<3L>_> **)this = this_00;
  if (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}